

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O0

iterator __thiscall
efsw::DirectorySnapshot::nodeInFiles_abi_cxx11_(DirectorySnapshot *this,FileInfo *fi)

{
  bool bVar1;
  pointer ppVar2;
  iterator iVar3;
  _Self local_38;
  _Base_ptr local_30;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
  local_28;
  iterator it;
  FileInfo *fi_local;
  DirectorySnapshot *this_local;
  
  it._M_node = (_Base_ptr)fi;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
  ::_Rb_tree_iterator(&local_28);
  bVar1 = FileInfo::inodeSupported();
  if (bVar1) {
    local_30 = (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
               ::begin(&this->Files);
    local_28._M_node = local_30;
    while( true ) {
      local_38._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
           ::end(&this->Files);
      bVar1 = std::operator!=(&local_28,&local_38);
      if (!bVar1) break;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
               ::operator->(&local_28);
      bVar1 = FileInfo::sameInode(&ppVar2->second,(FileInfo *)it._M_node);
      if (bVar1) {
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
                 ::operator->(&local_28);
        bVar1 = std::operator!=(&(ppVar2->second).Filepath,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )it._M_node);
        if (bVar1) {
          return (iterator)local_28._M_node;
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>
      ::operator++(&local_28,0);
    }
  }
  iVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
          ::end(&this->Files);
  return (iterator)iVar3._M_node;
}

Assistant:

FileInfoMap::iterator DirectorySnapshot::nodeInFiles( FileInfo& fi ) {
	FileInfoMap::iterator it;

	if ( FileInfo::inodeSupported() ) {
		for ( it = Files.begin(); it != Files.end(); it++ ) {
			if ( it->second.sameInode( fi ) && it->second.Filepath != fi.Filepath ) {
				return it;
			}
		}
	}

	return Files.end();
}